

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::load_omf(xr_ogf_v4 *this,xr_reader *r)

{
  bool bVar1;
  xr_reader *local_20;
  xr_reader *s;
  xr_reader *r_local;
  xr_ogf_v4 *this_local;
  
  (this->super_xr_ogf).m_model_type = MT4_OMF;
  s = r;
  r_local = (xr_reader *)this;
  local_20 = xr_reader::open_chunk(r,0xf);
  if (local_20 == (xr_reader *)0x0) {
    __assert_fail("s != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x2ea,"void xray_re::xr_ogf_v4::load_omf(xr_reader &)");
  }
  load_s_smparams(this,local_20);
  bVar1 = xr_reader::eof(local_20);
  if (!bVar1) {
    __assert_fail("s->eof()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x2ec,"void xray_re::xr_ogf_v4::load_omf(xr_reader &)");
  }
  xr_reader::close_chunk(s,&local_20);
  local_20 = xr_reader::open_chunk(s,0xe);
  if (local_20 == (xr_reader *)0x0) {
    __assert_fail("s != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x2f0,"void xray_re::xr_ogf_v4::load_omf(xr_reader &)");
  }
  load_s_motions(this,local_20);
  bVar1 = xr_reader::eof(local_20);
  if (!bVar1) {
    __assert_fail("s->eof()",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x2f2,"void xray_re::xr_ogf_v4::load_omf(xr_reader &)");
  }
  xr_reader::close_chunk(s,&local_20);
  xr_ogf::check_unhandled_chunks(&this->super_xr_ogf,s);
  return;
}

Assistant:

void xr_ogf_v4::load_omf(xr_reader& r)
{
	m_model_type = MT4_OMF;

	xr_reader* s = r.open_chunk(OGF4_S_SMPARAMS);
	xr_assert(s != 0);
	load_s_smparams(*s);
	assert(s->eof());
	r.close_chunk(s);

	s = r.open_chunk(OGF4_S_MOTIONS);
	xr_assert(s != 0);
	load_s_motions(*s);
	assert(s->eof());
	r.close_chunk(s);

	check_unhandled_chunks(r);
}